

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.h
# Opt level: O2

bool __thiscall QItemSelectionRange::contains(QItemSelectionRange *this,QModelIndex *index)

{
  int row;
  int column;
  bool bVar1;
  long in_FS_OFFSET;
  QModelIndex local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  row = index->r;
  column = index->c;
  QModelIndex::parent(&local_40,index);
  bVar1 = contains(this,row,column,&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline bool contains(const QModelIndex &index) const
    {
        return contains(index.row(), index.column(), index.parent());
    }